

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrGetReferenceSpaceBoundsRect
                   (XrSession session,XrReferenceSpaceType referenceSpaceType,XrExtent2Df *bounds)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrExtent2Df *bounds_local;
  XrSession pXStack_18;
  XrReferenceSpaceType referenceSpaceType_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)bounds;
  bounds_local._4_4_ = referenceSpaceType;
  pXStack_18 = session;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrGetReferenceSpaceBoundsRect");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->GetReferenceSpaceBoundsRect)
                         (pXStack_18,bounds_local._4_4_,(XrExtent2Df *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrGetReferenceSpaceBoundsRect(
    XrSession                                   session,
    XrReferenceSpaceType                        referenceSpaceType,
    XrExtent2Df*                                bounds) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrGetReferenceSpaceBoundsRect");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->GetReferenceSpaceBoundsRect(session, referenceSpaceType, bounds);
    }
    return result;
}